

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

bool __thiscall FakeCommandRunner::StartCommand(FakeCommandRunner *this,Edge *edge)

{
  int *piVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  VirtualFileSystem *pVVar4;
  Node *pNVar5;
  Edge *pEVar6;
  FakeCommandRunner *pFVar7;
  bool bVar8;
  int iVar9;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> _Var10;
  pointer ppNVar11;
  string err;
  string content;
  string contents;
  Edge *local_100;
  FakeCommandRunner *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppEVar2 = (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar3 = (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_100 = edge;
  if (this->max_active_edges_ <= (ulong)((long)ppEVar3 - (long)ppEVar2 >> 3)) {
    __assert_fail("active_edges_.size() < max_active_edges_",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                  ,0x24c,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
  }
  _Var10 = std::
           __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                     (ppEVar2,ppEVar3,&local_100);
  if (_Var10._M_current !=
      (this->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("find(active_edges_.begin(), active_edges_.end(), edge) == active_edges_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                  ,0x24e,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
  }
  Edge::EvaluateCommand_abi_cxx11_(&local_d0,local_100,false);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->commands_ran_,&local_d0);
  local_f8 = this;
  std::__cxx11::string::~string((string *)&local_d0);
  bVar8 = std::operator==(&local_100->rule_->name_,"cat");
  if (((((bVar8) || (bVar8 = std::operator==(&local_100->rule_->name_,"cat_rsp"), bVar8)) ||
       (bVar8 = std::operator==(&local_100->rule_->name_,"cat_rsp_out"), bVar8)) ||
      (((bVar8 = std::operator==(&local_100->rule_->name_,"cc"), bVar8 ||
        (bVar8 = std::operator==(&local_100->rule_->name_,"cp_multi_msvc"), bVar8)) ||
       ((bVar8 = std::operator==(&local_100->rule_->name_,"cp_multi_gcc"), bVar8 ||
        ((bVar8 = std::operator==(&local_100->rule_->name_,"touch"), bVar8 ||
         (bVar8 = std::operator==(&local_100->rule_->name_,"touch-interrupt"), bVar8)))))))) ||
     (bVar8 = std::operator==(&local_100->rule_->name_,"touch-fail-tick2"), bVar8)) {
    for (ppNVar11 = (local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppNVar11 !=
        (local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar11 = ppNVar11 + 1) {
      pVVar4 = local_f8->fs_;
      pNVar5 = *ppNVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"",(allocator<char> *)&local_f0);
      VirtualFileSystem::Create(pVVar4,&pNVar5->path_,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    goto LAB_00126b4f;
  }
  bVar8 = std::operator==(&local_100->rule_->name_,"true");
  if ((((bVar8) || (bVar8 = std::operator==(&local_100->rule_->name_,"fail"), bVar8)) ||
      (bVar8 = std::operator==(&local_100->rule_->name_,"interrupt"), bVar8)) ||
     (bVar8 = std::operator==(&local_100->rule_->name_,"console"), bVar8)) goto LAB_00126b4f;
  bVar8 = std::operator==(&local_100->rule_->name_,"cp");
  if (bVar8) {
    ppNVar11 = (local_100->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppNVar11 ==
        (local_100->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("!edge->inputs_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                    ,0x263,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
    }
    if ((long)(local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != 8) {
      __assert_fail("edge->outputs_.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                    ,0x264,"virtual bool FakeCommandRunner::StartCommand(Edge *)");
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    iVar9 = (*(local_f8->fs_->super_DiskInterface).super_FileReader._vptr_FileReader[2])
                      (local_f8->fs_,*ppNVar11,&local_d0,&local_f0);
    if (iVar9 == 0) {
      (*(local_f8->fs_->super_DiskInterface).super_FileReader._vptr_FileReader[5])
                (local_f8->fs_,
                 *(local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,&local_d0);
    }
LAB_00126b3b:
    std::__cxx11::string::~string((string *)&local_f0);
  }
  else {
    bVar8 = std::operator==(&local_100->rule_->name_,"touch-implicit-dep-out");
    pEVar6 = local_100;
    if (!bVar8) {
      bVar8 = std::operator==(&local_100->rule_->name_,"touch-out-implicit-dep");
      pEVar6 = local_100;
      if (bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"test_dependency",(allocator<char> *)&local_b0);
        Edge::GetBinding(&local_d0,pEVar6,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        for (ppNVar11 = (local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; pVVar4 = local_f8->fs_,
            ppNVar11 !=
            (local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppNVar11 = ppNVar11 + 1) {
          pNVar5 = *ppNVar11;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,"",(allocator<char> *)&local_b0);
          VirtualFileSystem::Create(pVVar4,&pNVar5->path_,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        pVVar4->now_ = pVVar4->now_ + 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"",(allocator<char> *)&local_b0);
        VirtualFileSystem::Create(pVVar4,&local_d0,&local_f0);
      }
      else {
        bVar8 = std::operator==(&local_100->rule_->name_,"generate-depfile");
        pEVar6 = local_100;
        if (!bVar8) {
          puts("unknown command");
          return false;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"test_dependency",(allocator<char> *)&local_b0);
        Edge::GetBinding(&local_d0,pEVar6,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        Edge::GetUnescapedDepfile_abi_cxx11_(&local_f0,local_100);
        pFVar7 = local_f8;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        for (ppNVar11 = (local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            ppNVar11 !=
            (local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppNVar11 = ppNVar11 + 1) {
          std::operator+(&local_90,&(*ppNVar11)->path_,": ");
          std::operator+(&local_50,&local_90,&local_d0);
          std::operator+(&local_70,&local_50,"\n");
          std::__cxx11::string::append((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_90);
          pVVar4 = pFVar7->fs_;
          pNVar5 = *ppNVar11;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"",(allocator<char> *)&local_50);
          VirtualFileSystem::Create(pVVar4,&pNVar5->path_,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
        VirtualFileSystem::Create(pFVar7->fs_,&local_f0,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      goto LAB_00126b3b;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"test_dependency",(allocator<char> *)&local_b0);
    Edge::GetBinding(&local_d0,pEVar6,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    pVVar4 = local_f8->fs_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"",(allocator<char> *)&local_b0);
    VirtualFileSystem::Create(pVVar4,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    piVar1 = &local_f8->fs_->now_;
    *piVar1 = *piVar1 + 1;
    for (ppNVar11 = (local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppNVar11 !=
        (local_100->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar11 = ppNVar11 + 1) {
      pVVar4 = local_f8->fs_;
      pNVar5 = *ppNVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"",(allocator<char> *)&local_b0);
      VirtualFileSystem::Create(pVVar4,&pNVar5->path_,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
  }
  std::__cxx11::string::~string((string *)&local_d0);
LAB_00126b4f:
  pFVar7 = local_f8;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(&local_f8->active_edges_,&local_100);
  std::
  __sort<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const*,Edge_const*)>>
            ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             (pFVar7->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             (pFVar7->active_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_Edge_*,_const_Edge_*)>)0x13f3ba);
  return true;
}

Assistant:

bool FakeCommandRunner::StartCommand(Edge* edge) {
  assert(active_edges_.size() < max_active_edges_);
  assert(find(active_edges_.begin(), active_edges_.end(), edge)
         == active_edges_.end());
  commands_ran_.push_back(edge->EvaluateCommand());
  if (edge->rule().name() == "cat"  ||
      edge->rule().name() == "cat_rsp" ||
      edge->rule().name() == "cat_rsp_out" ||
      edge->rule().name() == "cc" ||
      edge->rule().name() == "cp_multi_msvc" ||
      edge->rule().name() == "cp_multi_gcc" ||
      edge->rule().name() == "touch" ||
      edge->rule().name() == "touch-interrupt" ||
      edge->rule().name() == "touch-fail-tick2") {
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
  } else if (edge->rule().name() == "true" ||
             edge->rule().name() == "fail" ||
             edge->rule().name() == "interrupt" ||
             edge->rule().name() == "console") {
    // Don't do anything.
  } else if (edge->rule().name() == "cp") {
    assert(!edge->inputs_.empty());
    assert(edge->outputs_.size() == 1);
    string content;
    string err;
    if (fs_->ReadFile(edge->inputs_[0]->path(), &content, &err) ==
        DiskInterface::Okay)
      fs_->WriteFile(edge->outputs_[0]->path(), content);
  } else if (edge->rule().name() == "touch-implicit-dep-out") {
    string dep = edge->GetBinding("test_dependency");
    fs_->Create(dep, "");
    fs_->Tick();
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
  } else if (edge->rule().name() == "touch-out-implicit-dep") {
    string dep = edge->GetBinding("test_dependency");
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      fs_->Create((*out)->path(), "");
    }
    fs_->Tick();
    fs_->Create(dep, "");
  } else if (edge->rule().name() == "generate-depfile") {
    string dep = edge->GetBinding("test_dependency");
    string depfile = edge->GetUnescapedDepfile();
    string contents;
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      contents += (*out)->path() + ": " + dep + "\n";
      fs_->Create((*out)->path(), "");
    }
    fs_->Create(depfile, contents);
  } else {
    printf("unknown command\n");
    return false;
  }

  active_edges_.push_back(edge);

  // Allow tests to control the order by the name of the first output.
  sort(active_edges_.begin(), active_edges_.end(),
       CompareEdgesByOutput::cmp);

  return true;
}